

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O1

void __thiscall libmatroska::KaxBlockGroup::SetBlockDuration(KaxBlockGroup *this,uint64 TimeLength)

{
  KaxTrackEntry *pKVar1;
  ulong uVar2;
  EbmlElement *pEVar3;
  
  pKVar1 = this->ParentTrack;
  if (pKVar1 == (KaxTrackEntry *)0x0) {
    __assert_fail("ParentTrack != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0x365,"void libmatroska::KaxBlockGroup::SetBlockDuration(uint64)");
  }
  if (pKVar1->bGlobalTimecodeScaleIsSet != false) {
    uVar2 = pKVar1->mGlobalTimecodeScale;
    pEVar3 = libebml::EbmlMaster::FindFirstElt
                       (&this->super_EbmlMaster,(EbmlCallbacks *)KaxBlockDuration::ClassInfos,true);
    pEVar3[1]._vptr_EbmlElement = (_func_int **)(TimeLength / uVar2);
    pEVar3->bValueIsSet = true;
    return;
  }
  __assert_fail("bGlobalTimecodeScaleIsSet",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/./matroska/KaxTracks.h"
                ,0x43,"uint64 libmatroska::KaxTrackEntry::GlobalTimecodeScale() const");
}

Assistant:

void KaxBlockGroup::SetBlockDuration(uint64 TimeLength)
{
  assert(ParentTrack != NULL);
  int64 scale = ParentTrack->GlobalTimecodeScale();
  KaxBlockDuration & myDuration = *static_cast<KaxBlockDuration *>(FindFirstElt(EBML_INFO(KaxBlockDuration), true));
  *(static_cast<EbmlUInteger *>(&myDuration)) = TimeLength / uint64(scale);
}